

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaxRectsBinPack.cpp
# Opt level: O2

Rect * __thiscall
rbp::MaxRectsBinPack::FindPositionForNewNodeContactPoint
          (Rect *__return_storage_ptr__,MaxRectsBinPack *this,int width,int height,
          int *bestContactScore)

{
  int x;
  int y;
  pointer pRVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  
  __return_storage_ptr__->tag = 0;
  *bestContactScore = -1;
  pRVar1 = (this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = ((long)(this->freeRectangles).super__Vector_base<rbp::Rect,_std::allocator<rbp::Rect>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x14;
  piVar4 = &pRVar1->height;
  local_4c = -1;
  local_50 = 0;
  local_54 = 0;
  local_5c = 0;
  local_58 = 0;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    if ((width <= piVar4[-1]) && (height <= *piVar4)) {
      x = ((Rect *)(piVar4 + -3))->x;
      y = piVar4[-2];
      iVar2 = ContactPointScoreNode(this,x,y,width,height);
      if (local_4c < iVar2) {
        *bestContactScore = iVar2;
        local_5c = y;
        local_58 = x;
        local_54 = width;
        local_50 = height;
        local_4c = iVar2;
      }
    }
    piVar4 = piVar4 + 5;
  }
  __return_storage_ptr__->y = local_5c;
  __return_storage_ptr__->width = local_54;
  __return_storage_ptr__->height = local_50;
  __return_storage_ptr__->x = local_58;
  return __return_storage_ptr__;
}

Assistant:

Rect MaxRectsBinPack::FindPositionForNewNodeContactPoint(int width, int height, int& bestContactScore) const
	{
		Rect bestNode;
		memset(&bestNode, 0, sizeof(Rect));

		bestContactScore = -1;

		for (size_t i = 0; i < freeRectangles.size(); ++i)
		{
			// Try to place the rectangle in upright (non-flipped) orientation.
			if (freeRectangles[i].width >= width && freeRectangles[i].height >= height)
			{
				int score = ContactPointScoreNode(freeRectangles[i].x, freeRectangles[i].y, width, height);
				if (score > bestContactScore)
				{
					bestNode.x = freeRectangles[i].x;
					bestNode.y = freeRectangles[i].y;
					bestNode.width = width;
					bestNode.height = height;
					bestContactScore = score;
				}
			}
#ifdef CAN_FLIP
		if (freeRectangles[i].width >= height && freeRectangles[i].height >= width)
		{
			int score = ContactPointScoreNode(freeRectangles[i].x, freeRectangles[i].y, height, width);
			if (score > bestContactScore)
			{
				bestNode.x = freeRectangles[i].x;
				bestNode.y = freeRectangles[i].y;
				bestNode.width = height;
				bestNode.height = width;
				bestContactScore = score;
			}
		}
#endif
		}
		return bestNode;
	}